

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::TextV(char *fmt,__va_list_tag *args)

{
  ImGuiWindow *args_00;
  char *in_RSI;
  char **in_RDI;
  char *text_end;
  char *text;
  ImGuiWindow *window;
  ImGuiTextFlags in_stack_00000104;
  char *in_stack_00000108;
  char *in_stack_00000110;
  
  args_00 = GetCurrentWindow();
  if ((args_00->SkipItems & 1U) == 0) {
    ImFormatStringToTempBufferV((char **)text_end,in_RDI,in_RSI,(__va_list_tag *)args_00);
    TextEx(in_stack_00000110,in_stack_00000108,in_stack_00000104);
  }
  return;
}

Assistant:

void ImGui::TextV(const char* fmt, va_list args)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return;

    // FIXME-OPT: Handle the %s shortcut?
    const char* text, *text_end;
    ImFormatStringToTempBufferV(&text, &text_end, fmt, args);
    TextEx(text, text_end, ImGuiTextFlags_NoWidthForLargeClippedText);
}